

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_decompress_wksp(void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,
                          FSE_DTable *workSpace,uint maxLog)

{
  uint uVar1;
  void *cSrc_00;
  size_t cSrcSize_00;
  size_t e;
  size_t NCountLength;
  uint maxSymbolValue;
  uint tableLog;
  short counting [256];
  BYTE *ip;
  BYTE *istart;
  uint maxLog_local;
  FSE_DTable *workSpace_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  NCountLength._0_4_ = 0xff;
  dst_local = (void *)FSE_readNCount((short *)&maxSymbolValue,(uint *)&NCountLength,
                                     (uint *)((long)&NCountLength + 4),cSrc,cSrcSize);
  uVar1 = ERR_isError((size_t)dst_local);
  if (uVar1 == 0) {
    if (maxLog < NCountLength._4_4_) {
      dst_local = (void *)0xffffffffffffffd4;
    }
    else {
      cSrc_00 = (void *)((long)dst_local + (long)cSrc);
      cSrcSize_00 = cSrcSize - (long)dst_local;
      dst_local = (void *)FSE_buildDTable(workSpace,(short *)&maxSymbolValue,(uint)NCountLength,
                                          NCountLength._4_4_);
      uVar1 = ERR_isError((size_t)dst_local);
      if (uVar1 == 0) {
        dst_local = (void *)FSE_decompress_usingDTable
                                      (dst,dstCapacity,cSrc_00,cSrcSize_00,workSpace);
      }
    }
  }
  return (size_t)dst_local;
}

Assistant:

size_t FSE_decompress_wksp(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, FSE_DTable* workSpace, unsigned maxLog)
{
    const BYTE* const istart = (const BYTE*)cSrc;
    const BYTE* ip = istart;
    short counting[FSE_MAX_SYMBOL_VALUE+1];
    unsigned tableLog;
    unsigned maxSymbolValue = FSE_MAX_SYMBOL_VALUE;

    /* normal FSE decoding mode */
    size_t const NCountLength = FSE_readNCount (counting, &maxSymbolValue, &tableLog, istart, cSrcSize);
    if (FSE_isError(NCountLength)) return NCountLength;
    //if (NCountLength >= cSrcSize) return ERROR(srcSize_wrong);   /* too small input size; supposed to be already checked in NCountLength, only remaining case : NCountLength==cSrcSize */
    if (tableLog > maxLog) return ERROR(tableLog_tooLarge);
    ip += NCountLength;
    cSrcSize -= NCountLength;

    CHECK_F( FSE_buildDTable (workSpace, counting, maxSymbolValue, tableLog) );

    return FSE_decompress_usingDTable (dst, dstCapacity, ip, cSrcSize, workSpace);   /* always return, even if it is an error code */
}